

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O3

aom_codec_cx_pkt_t * aom_codec_pkt_list_get(aom_codec_pkt_list *list,aom_codec_iter_t *iter)

{
  aom_codec_cx_pkt_t *paVar1;
  
  paVar1 = (aom_codec_cx_pkt_t *)*iter;
  if (paVar1 == (aom_codec_cx_pkt_t *)0x0) {
    paVar1 = list->pkts;
    *iter = paVar1;
  }
  if ((ulong)(((long)paVar1 + (-8 - (long)list) >> 3) * -0x30c30c30c30c30c3) < (ulong)list->cnt) {
    *iter = paVar1 + 1;
    return paVar1;
  }
  return (aom_codec_cx_pkt_t *)0x0;
}

Assistant:

const aom_codec_cx_pkt_t *aom_codec_pkt_list_get(
    struct aom_codec_pkt_list *list, aom_codec_iter_t *iter) {
  const aom_codec_cx_pkt_t *pkt;

  if (!(*iter)) {
    *iter = list->pkts;
  }

  pkt = (const aom_codec_cx_pkt_t *)*iter;

  if ((size_t)(pkt - list->pkts) < list->cnt)
    *iter = pkt + 1;
  else
    pkt = NULL;

  return pkt;
}